

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackIFWGenerator::GetGroupPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,cmCPackComponentGroup *group)

{
  char *pcVar1;
  __type local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  byte local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  byte local_f9;
  cmCPackIFWPackage *pcStack_f8;
  bool dot;
  cmCPackIFWPackage *package_1;
  string local_e8 [32];
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  char *local_68;
  char *option;
  cmCPackIFWPackage *local_50;
  cmCPackIFWPackage *package;
  undefined1 local_40 [8];
  string name;
  cmCPackComponentGroup *group_local;
  cmCPackIFWGenerator *this_local;
  
  name.field_2._8_8_ = group;
  std::__cxx11::string::string((string *)local_40);
  if (name.field_2._8_8_ == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
  }
  else {
    local_50 = GetGroupPackage(this,(cmCPackComponentGroup *)name.field_2._8_8_);
    if (local_50 == (cmCPackIFWPackage *)0x0) {
      cmsys::SystemTools::UpperCase(&local_c8,(string *)name.field_2._8_8_);
      std::operator+(&local_a8,"CPACK_IFW_COMPONENT_GROUP_",&local_c8);
      std::operator+(&local_88,&local_a8,"_NAME");
      pcVar1 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      package_1._6_1_ = 0;
      local_68 = pcVar1;
      if (pcVar1 == (char *)0x0) {
        std::__cxx11::string::string(local_e8,(string *)name.field_2._8_8_);
      }
      else {
        std::allocator<char>::allocator();
        package_1._6_1_ = 1;
        std::__cxx11::string::string(local_e8,pcVar1,(allocator *)((long)&package_1 + 7));
      }
      std::__cxx11::string::operator=((string *)local_40,local_e8);
      std::__cxx11::string::~string(local_e8);
      if ((package_1._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&package_1 + 7));
      }
      if (*(long *)(name.field_2._8_8_ + 0x80) != 0) {
        pcStack_f8 = GetGroupPackage(this,*(cmCPackComponentGroup **)(name.field_2._8_8_ + 0x80));
        local_f9 = (this->ResolveDuplicateNames ^ 0xffU) & 1;
        local_121 = 0;
        local_1a9 = false;
        if (local_f9 != 0) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)&local_120,(ulong)local_40);
          local_121 = 1;
          local_1a9 = std::operator==(&local_120,&pcStack_f8->Name);
        }
        if ((local_121 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_120);
        }
        if (local_1a9 != false) {
          local_f9 = 0;
        }
        if ((local_f9 & 1) != 0) {
          std::operator+(&local_168,&pcStack_f8->Name,".");
          std::operator+(&local_148,&local_168,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          std::__cxx11::string::operator=((string *)local_40,(string *)&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_168);
        }
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_50->Name);
    }
  }
  package._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmCPackIFWGenerator::GetGroupPackageName(cmCPackComponentGroup *group) const
{
  std::string name;
  if (!group) return name;
  if (cmCPackIFWPackage* package = GetGroupPackage(group))
    {
    return package->Name;
    }
  const char* option = GetOption(
    "CPACK_IFW_COMPONENT_GROUP_"
    + cmsys::SystemTools::UpperCase(group->Name)
    + "_NAME");
  name = option ? option : group->Name;
  if(group->ParentGroup)
    {
    cmCPackIFWPackage* package = GetGroupPackage(group->ParentGroup);
    bool dot = !ResolveDuplicateNames;
    if(dot && name.substr(0, package->Name.size()) == package->Name)
      {
      dot = false;
      }
    if(dot)
      {
      name = package->Name + "." + name;
      }
    }
  return name;
}